

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_api.c
# Opt level: O2

MPP_RET hal_h263d_init(void *hal,MppHalCfg *cfg)

{
  MppBufSlots pvVar1;
  RK_U32 RVar2;
  MPP_RET MVar3;
  char *fmt;
  code *pcVar4;
  uint uVar5;
  code *pcVar6;
  code *pcVar7;
  code *UNRECOVERED_JUMPTABLE;
  code *local_38;
  
  mpp_env_get_u32("h263d_hal_debug",&h263d_hal_debug,0);
  memset(hal,0,0x90);
  pvVar1 = cfg->packet_slots;
  *(MppBufSlots *)((long)hal + 0x58) = cfg->frame_slots;
  *(MppBufSlots *)((long)hal + 0x60) = pvVar1;
  RVar2 = mpp_get_vcodec_type();
  uVar5 = 2;
  if ((RVar2 & 1) == 0) {
    uVar5 = RVar2 * 2 & 4;
  }
  if (uVar5 == 4) {
    local_38 = hal_vpu2_h263d_wait;
    pcVar6 = hal_vpu2_h263d_start;
    pcVar7 = hal_vpu2_h263d_gen_regs;
    pcVar4 = hal_vpu2_h263d_deinit;
    UNRECOVERED_JUMPTABLE = hal_vpu2_h263d_init;
    fmt = "the VDPU2_MODE is used currently!\n";
  }
  else {
    if (uVar5 != 2) {
      _mpp_log_l(2,(char *)0x0,"unknow vpu type:%d.",(char *)0x0);
      return MPP_ERR_INIT;
    }
    local_38 = hal_vpu1_h263d_wait;
    pcVar6 = hal_vpu1_h263d_start;
    pcVar7 = hal_vpu1_h263d_gen_regs;
    pcVar4 = hal_vpu1_h263d_deinit;
    UNRECOVERED_JUMPTABLE = hal_vpu1_h263d_init;
    fmt = "the VDPU1_MODE is used currently!\n";
  }
  _mpp_log_l(4,(char *)0x0,fmt,(char *)0x0);
  *(code **)((long)hal + 0x18) = UNRECOVERED_JUMPTABLE;
  *(code **)((long)hal + 0x20) = pcVar4;
  *(code **)((long)hal + 0x28) = pcVar7;
  *(code **)((long)hal + 0x30) = pcVar6;
  *(code **)((long)hal + 0x38) = local_38;
  *(undefined8 *)((long)hal + 0x50) = 0;
  *(undefined8 *)((long)hal + 0x40) = 0;
  *(undefined8 *)((long)hal + 0x48) = 0;
  MVar3 = (*UNRECOVERED_JUMPTABLE)(hal,cfg);
  return MVar3;
}

Assistant:

static MPP_RET hal_h263d_init(void *hal, MppHalCfg *cfg)
{
    MppHalApi *p_api = NULL;
    hal_h263_ctx *p_hal = (hal_h263_ctx *)hal;
    VpuHwMode hw_mode = MODE_NULL;
    RK_U32 hw_flag = 0;

    mpp_env_get_u32("h263d_hal_debug", &h263d_hal_debug, 0);

    memset(p_hal, 0, sizeof(hal_h263_ctx));
    p_api = &p_hal->hal_api;

    p_hal->frm_slots = cfg->frame_slots;
    p_hal->pkt_slots = cfg->packet_slots;

    hw_flag = mpp_get_vcodec_type();
    if (hw_flag & HAVE_VDPU2)
        hw_mode = VDPU2_MODE;
    if (hw_flag & HAVE_VDPU1)
        hw_mode = VDPU1_MODE;

    switch (hw_mode) {
    case VDPU2_MODE : {
        mpp_log("the VDPU2_MODE is used currently!\n");
        p_api->init    = hal_vpu2_h263d_init;
        p_api->deinit  = hal_vpu2_h263d_deinit;
        p_api->reg_gen = hal_vpu2_h263d_gen_regs;
        p_api->start   = hal_vpu2_h263d_start;
        p_api->wait    = hal_vpu2_h263d_wait;
        p_api->reset   = NULL;
        p_api->flush   = NULL;
        p_api->control = NULL;
    } break;
    case VDPU1_MODE : {
        mpp_log("the VDPU1_MODE is used currently!\n");
        p_api->init    = hal_vpu1_h263d_init;
        p_api->deinit  = hal_vpu1_h263d_deinit;
        p_api->reg_gen = hal_vpu1_h263d_gen_regs;
        p_api->start   = hal_vpu1_h263d_start;
        p_api->wait    = hal_vpu1_h263d_wait;
        p_api->reset   = NULL;
        p_api->flush   = NULL;
        p_api->control = NULL;
    } break;
    default : {
        mpp_err("unknow vpu type:%d.", hw_mode);
        return MPP_ERR_INIT;
    } break;
    }

    return p_api->init(hal, cfg);
}